

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O2

int webm_read_frame(WebmInputContext *webm_ctx,uint8_t **buffer,size_t *bytes_read,
                   size_t *buffer_size)

{
  Segment *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  Cluster *pCurr;
  Block *this_00;
  Frame *this_01;
  uint8_t *puVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  BlockEntry *block_entry;
  int local_4c;
  uint8_t **local_48;
  size_t *local_40;
  size_t *local_38;
  undefined4 extraout_var;
  
  if (webm_ctx->reached_eos != 0) {
    return 1;
  }
  this = (Segment *)webm_ctx->segment;
  pCurr = (Cluster *)webm_ctx->cluster;
  this_00 = (Block *)webm_ctx->block;
  block_entry = (BlockEntry *)webm_ctx->block_entry;
  bVar2 = false;
  local_4c = -1;
  local_48 = buffer;
  local_40 = buffer_size;
  local_38 = bytes_read;
LAB_00122e8b:
  do {
    if (block_entry == (BlockEntry *)0x0) {
      if (bVar2) goto LAB_00122edd;
LAB_00122f07:
      lVar7 = mkvparser::Cluster::GetFirst(pCurr,&block_entry);
      bVar1 = true;
    }
    else {
      if ((bVar2) || (iVar3 = (*block_entry->_vptr_BlockEntry[3])(), iVar3 == 0)) {
LAB_00122edd:
        pCurr = mkvparser::Segment::GetNext(this,pCurr);
        if ((pCurr == (Cluster *)0x0) || (bVar2 = mkvparser::Cluster::EOS(pCurr), bVar2)) {
          *local_38 = 0;
          webm_ctx->reached_eos = 1;
          return 1;
        }
        bVar2 = false;
        goto LAB_00122f07;
      }
      if (((this_00 == (Block *)0x0) ||
          (iVar3 = webm_ctx->block_frame_index, iVar4 = mkvparser::Block::GetFrameCount(this_00),
          iVar3 == iVar4)) ||
         (lVar5 = mkvparser::Block::GetTrackNumber(this_00), lVar5 != webm_ctx->video_track_index))
      {
        lVar7 = mkvparser::Cluster::GetNext(pCurr,block_entry,&block_entry);
        if (block_entry != (BlockEntry *)0x0) {
          iVar3 = (*block_entry->_vptr_BlockEntry[3])();
          bVar1 = true;
          if (iVar3 != 0) goto LAB_00122f17;
        }
        bVar2 = true;
        goto LAB_00122e8b;
      }
      lVar7 = 0;
      bVar1 = false;
    }
LAB_00122f17:
    if (lVar7 != 0) {
      return local_4c;
    }
    if (block_entry == (BlockEntry *)0x0) {
      return local_4c;
    }
    if (bVar1) {
      iVar3 = (*block_entry->_vptr_BlockEntry[2])();
      this_00 = (Block *)CONCAT44(extraout_var,iVar3);
      if (this_00 == (Block *)0x0) {
        return local_4c;
      }
      webm_ctx->block_frame_index = 0;
    }
    if ((!bVar2) &&
       (lVar5 = mkvparser::Block::GetTrackNumber(this_00), lVar5 == webm_ctx->video_track_index)) {
      webm_ctx->cluster = pCurr;
      webm_ctx->block_entry = block_entry;
      webm_ctx->block = this_00;
      this_01 = mkvparser::Block::GetFrame(this_00,webm_ctx->block_frame_index);
      webm_ctx->block_frame_index = webm_ctx->block_frame_index + 1;
      sVar9 = this_01->len;
      if ((long)*local_40 < (long)sVar9) {
        if (*local_48 != (uint8_t *)0x0) {
          operator_delete__(*local_48);
          sVar9 = this_01->len;
        }
        uVar8 = 0xffffffffffffffff;
        if (-1 < (long)sVar9) {
          uVar8 = sVar9;
        }
        puVar6 = (uint8_t *)operator_new__(uVar8);
        *local_48 = puVar6;
        webm_ctx->buffer = puVar6;
        if (*local_48 == (uint8_t *)0x0) {
          return local_4c;
        }
        *local_40 = sVar9;
        sVar9 = this_01->len;
      }
      *local_38 = sVar9;
      lVar5 = mkvparser::Block::GetTime(this_00,pCurr);
      webm_ctx->timestamp_ns = lVar5;
      bVar2 = mkvparser::Block::IsKey(this_00);
      webm_ctx->is_key_frame = (uint)bVar2;
      lVar7 = mkvparser::Block::Frame::Read(this_01,(IMkvReader *)webm_ctx->reader,*local_48);
      return -(uint)(lVar7 != 0);
    }
  } while( true );
}

Assistant:

int webm_read_frame(struct WebmInputContext *webm_ctx, uint8_t **buffer,
                    size_t *bytes_read, size_t *buffer_size) {
  assert(webm_ctx->buffer == *buffer);
  // This check is needed for frame parallel decoding, in which case this
  // function could be called even after it has reached end of input stream.
  if (webm_ctx->reached_eos) {
    return 1;
  }
  mkvparser::Segment *const segment =
      reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
  const mkvparser::Cluster *cluster =
      reinterpret_cast<const mkvparser::Cluster *>(webm_ctx->cluster);
  const mkvparser::Block *block =
      reinterpret_cast<const mkvparser::Block *>(webm_ctx->block);
  const mkvparser::BlockEntry *block_entry =
      reinterpret_cast<const mkvparser::BlockEntry *>(webm_ctx->block_entry);
  bool block_entry_eos = false;
  do {
    long status = 0;
    bool get_new_block = false;
    if (block_entry == NULL && !block_entry_eos) {
      status = cluster->GetFirst(block_entry);
      get_new_block = true;
    } else if (block_entry_eos || block_entry->EOS()) {
      cluster = segment->GetNext(cluster);
      if (cluster == NULL || cluster->EOS()) {
        *bytes_read = 0;
        webm_ctx->reached_eos = 1;
        return 1;
      }
      status = cluster->GetFirst(block_entry);
      block_entry_eos = false;
      get_new_block = true;
    } else if (block == NULL ||
               webm_ctx->block_frame_index == block->GetFrameCount() ||
               block->GetTrackNumber() != webm_ctx->video_track_index) {
      status = cluster->GetNext(block_entry, block_entry);
      if (block_entry == NULL || block_entry->EOS()) {
        block_entry_eos = true;
        continue;
      }
      get_new_block = true;
    }
    if (status || block_entry == NULL) {
      return -1;
    }
    if (get_new_block) {
      block = block_entry->GetBlock();
      if (block == NULL) return -1;
      webm_ctx->block_frame_index = 0;
    }
  } while (block_entry_eos ||
           block->GetTrackNumber() != webm_ctx->video_track_index);

  webm_ctx->cluster = cluster;
  webm_ctx->block_entry = block_entry;
  webm_ctx->block = block;

  const mkvparser::Block::Frame &frame =
      block->GetFrame(webm_ctx->block_frame_index);
  ++webm_ctx->block_frame_index;
  if (frame.len > static_cast<long>(*buffer_size)) {
    delete[] * buffer;
    *buffer = new uint8_t[frame.len];
    webm_ctx->buffer = *buffer;
    if (*buffer == NULL) {
      return -1;
    }
    *buffer_size = frame.len;
  }
  *bytes_read = frame.len;
  webm_ctx->timestamp_ns = block->GetTime(cluster);
  webm_ctx->is_key_frame = block->IsKey();

  mkvparser::MkvReader *const reader =
      reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
  return frame.Read(reader, *buffer) ? -1 : 0;
}